

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

DdNode * extraZddCombination(DdManager *dd,int *VarValues,int nVars)

{
  int *piVar1;
  bool bVar2;
  ulong uVar3;
  DdNode *pDVar4;
  DdNode *T;
  int id;
  
  pDVar4 = dd->one;
  piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  if (0 < nVars) {
    uVar3 = (ulong)(uint)nVars;
    T = pDVar4;
    do {
      if ((long)dd->sizeZ < (long)uVar3) {
        id = (int)(uVar3 - 1);
      }
      else {
        id = dd->invpermZ[uVar3 - 1];
      }
      pDVar4 = T;
      if (VarValues[id] == 1) {
        pDVar4 = cuddZddGetNode(dd,id,T,dd->zero);
        if (pDVar4 == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,T);
          return (DdNode *)0x0;
        }
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
      }
      bVar2 = 1 < (long)uVar3;
      uVar3 = uVar3 - 1;
      T = pDVar4;
    } while (bVar2);
  }
  piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + -1;
  return pDVar4;
}

Assistant:

DdNode * extraZddCombination(
  DdManager* dd, 
  int* VarValues, 
  int nVars )
{
    int lev, index;
    DdNode *zRes, *zTemp;

    /* transform the combination from the array VarValues into a ZDD cube. */
    zRes = dd->one;
    cuddRef(zRes);

    /*  go through levels starting bottom-up and create nodes 
     *  if these variables are present in the comb
     */
    for (lev = nVars - 1; lev >= 0; lev--) 
    { 
        index = (lev >= dd->sizeZ) ? lev : dd->invpermZ[lev];
        if (VarValues[index] == 1) 
        {
            /* compose zRes with ZERO for the given ZDD variable */
            zRes = cuddZddGetNode( dd, index, zTemp = zRes, dd->zero );
            if ( zRes == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                return NULL;
            }
            cuddRef( zRes );
            cuddDeref( zTemp );
        }
    }
    cuddDeref( zRes );
    return zRes;

}